

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap4.c
# Opt level: O0

void ftl2c_(int *A1,char *A2,int *A3,size_t C2)

{
  int lval;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_70;
  unsigned_long local_58;
  char local_48 [8];
  char str [21];
  char *B2;
  size_t C2_local;
  int *A3_local;
  char *A2_local;
  int *A1_local;
  
  stack0xffffffffffffffd0 = (char *)0x0;
  lval = *A1;
  local_58 = C2;
  if (C2 <= gMinStrLen) {
    local_58 = gMinStrLen;
  }
  register0x00000000 = (char *)malloc(local_58 + 1);
  register0x00000000[C2] = '\0';
  memcpy(register0x00000000,A2,C2);
  pcVar1 = kill_trailing(stack0xffffffffffffffd0,' ');
  ffl2c(lval,pcVar1,A3);
  snprintf(local_48,0x15,"%20s",stack0xffffffffffffffd0);
  strcpy(stack0xffffffffffffffd0,local_48);
  pcVar1 = stack0xffffffffffffffd0;
  if (stack0xffffffffffffffd0 != (char *)0x0) {
    sVar2 = strlen(stack0xffffffffffffffd0);
    local_70 = C2;
    if (sVar2 < C2) {
      local_70 = strlen(stack0xffffffffffffffd0);
    }
    memcpy(A2,pcVar1,local_70);
    sVar2 = strlen(stack0xffffffffffffffd0);
    if (sVar2 < C2) {
      sVar2 = strlen(stack0xffffffffffffffd0);
      sVar3 = strlen(stack0xffffffffffffffd0);
      memset(A2 + sVar2,0x20,C2 - sVar3);
    }
    free(stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

CFextern VOID_cfF(FTL2C,ftl2c)
CFARGT14(NCF,DCF,ABSOFT_cf2(VOID),LOGICAL,PSTRING,PINT,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0,CF_0))
{
   QCF(LOGICAL,1)
   QCF(PSTRING,2)
   QCF(PINT,3)
   char str[21];

   ffl2c( TCF(ftl2c,LOGICAL,1,0) 
          TCF(ftl2c,PSTRING,2,1) 
          TCF(ftl2c,PINT,3,1) );

   snprintf(str,21,"%20s",B2);
   strcpy(B2,str);

   RCF(LOGICAL,1)
   RCF(PSTRING,2)
   RCF(PINT,3)
}